

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O2

Dict * tagsLookup(TidyDocImpl *doc,TidyTagImpl *tags,ctmbstr s)

{
  DictHash *pDVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  DictHash **ppDVar5;
  Dict *old;
  Dict **ppDVar6;
  ulong uVar7;
  
  if (s == (ctmbstr)0x0) {
LAB_0013d647:
    old = (Dict *)0x0;
  }
  else {
    uVar2 = tagsHash(s);
    ppDVar5 = tags->hashtab + uVar2;
    while ((pDVar1 = *ppDVar5, pDVar1 != (DictHash *)0x0 && (pDVar1->tag != (Dict *)0x0))) {
      iVar3 = prvTidytmbstrcmp(s,pDVar1->tag->name);
      if (iVar3 == 0) {
        return pDVar1->tag;
      }
      ppDVar5 = &pDVar1->next;
    }
    lVar4 = __tls_get_addr(&PTR_001e3fb0);
    uVar7 = 0x40;
    do {
      if (0x263f < uVar7) {
        ppDVar6 = &tags->declared_tag_list;
        goto LAB_0013d627;
      }
      iVar3 = prvTidytmbstrcmp(s,*(ctmbstr *)(lVar4 + 8 + uVar7));
      uVar7 = uVar7 + 0x40;
    } while (iVar3 != 0);
    old = (Dict *)(lVar4 + uVar7 + -0x40);
LAB_0013d613:
    tagsInstall(doc,tags,old);
  }
  return old;
LAB_0013d627:
  old = *ppDVar6;
  if (old == (Dict *)0x0) goto LAB_0013d647;
  iVar3 = prvTidytmbstrcmp(s,old->name);
  if (iVar3 == 0) goto LAB_0013d613;
  ppDVar6 = &old->next;
  goto LAB_0013d627;
}

Assistant:

static const Dict* tagsLookup( TidyDocImpl* doc, TidyTagImpl* tags, ctmbstr s )
{
    const Dict *np;
    const DictHash* p;

    if (!s)
        return NULL;

    /* this breaks if declared elements get changed between two   */
    /* parser runs since Tidy would use the cached version rather */
    /* than the new one.                                          */
    /* However, as FreeDeclaredTags() correctly cleans the hash   */
    /* this should not be true anymore.                           */
    for (p = tags->hashtab[tagsHash(s)]; p && p->tag; p = p->next)
        if (TY_(tmbstrcmp)(s, p->tag->name) == 0)
            return p->tag;

    for (np = tag_defs + 1; np < tag_defs + N_TIDY_TAGS; ++np)
        if (TY_(tmbstrcmp)(s, np->name) == 0)
            return tagsInstall(doc, tags, np);

    for (np = tags->declared_tag_list; np; np = np->next)
        if (TY_(tmbstrcmp)(s, np->name) == 0)
            return tagsInstall(doc, tags, np);

    return NULL;
}